

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debugstream.cpp
# Opt level: O1

void __thiscall MetaSim::DebugStream::enter(DebugStream *this,string *s,string *header)

{
  pointer pcVar1;
  ostream *poVar2;
  string local_40;
  
  pcVar1 = (s->_M_dataplus)._M_p;
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_40,pcVar1,pcVar1 + s->_M_string_length)
  ;
  enter(this,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  if ((this->_isDebug != false) || ((this->_isDebugAll & 1U) != 0)) {
    indent(this);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (this->_os,(header->_M_dataplus)._M_p,header->_M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    this->_isIndenting = true;
    this->_indentLevel = this->_indentLevel + 1;
  }
  return;
}

Assistant:

void DebugStream::enter(std::string s, std::string header) 
    {
        enter(s);
        if (filter()) {
            indent();
            (*_os) << header << endl;
            resetIndent();
            _indentLevel++;
        }
    }